

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp6.c
# Opt level: O0

DEFBUF * lookid(Global *global,int c)

{
  char *pcVar1;
  uint uVar2;
  int in_ESI;
  int iVar3;
  long in_RDI;
  int isrecurse;
  int temp;
  int ct;
  DEFBUF *dp;
  int nhash;
  Global *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  undefined3 uVar4;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar5;
  uint in_stack_ffffffffffffffdc;
  int iVar6;
  DEFBUF *local_20;
  int local_18;
  int local_14;
  DEFBUF *local_8;
  
  local_18 = 0;
  iVar5 = 0;
  uVar2 = (uint)(in_ESI == 0x1d);
  local_14 = in_ESI;
  if (in_ESI == 0x1d) {
    local_14 = get((Global *)((ulong)in_stack_ffffffffffffffdc << 0x20));
  }
  iVar6 = 0;
  do {
    if (iVar6 == *(int *)(in_RDI + 0x1c)) {
      *(int *)(in_RDI + 0x1c) = *(int *)(in_RDI + 0x1c) << 1;
      pcVar1 = incmem((Global *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8,
                      (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
      *(char **)(in_RDI + 8) = pcVar1;
    }
    iVar3 = iVar6 + 1;
    *(char *)(*(long *)(in_RDI + 8) + (long)iVar6) = (char)local_14;
    local_18 = local_14 + local_18;
    local_14 = get((Global *)CONCAT44(iVar3,iVar5));
    uVar4 = (undefined3)in_stack_ffffffffffffffd0;
    in_stack_ffffffffffffffd0 = CONCAT13(1,uVar4);
    if (type[local_14] != '\x02') {
      in_stack_ffffffffffffffd0 = CONCAT13(type[local_14] == '\x01',uVar4);
    }
    iVar6 = iVar3;
  } while ((char)((uint)in_stack_ffffffffffffffd0 >> 0x18) != '\0');
  unget(in_stack_ffffffffffffffc0);
  *(undefined1 *)(*(long *)(in_RDI + 8) + (long)iVar3) = 0;
  if (uVar2 == 0) {
    local_20 = *(DEFBUF **)(in_RDI + 0x958 + (long)((iVar3 + local_18) % 0x40) * 8);
    while ((local_20 != (DEFBUF *)0x0 &&
           ((local_20->hash != (long)(iVar3 + local_18) ||
            (iVar5 = strcmp(local_20->name,*(char **)(in_RDI + 8)), iVar5 < 0))))) {
      local_20 = local_20->link;
    }
    local_8 = local_20;
    if (iVar5 != 0) {
      local_8 = (DEFBUF *)0x0;
    }
  }
  else {
    local_8 = (DEFBUF *)0x0;
  }
  return local_8;
}

Assistant:

DEFBUF *lookid(struct Global *global,
	       int c)		/* First character of token	*/
{
  /*
   * Look for the next token in the symbol table. Returns token in tokenbuf.
   * If found, returns the table pointer;  Else returns NULL.
   */

  int nhash;
  DEFBUF *dp;
  int ct;
  int temp;
  int isrecurse;	/* For #define foo foo	*/
  
  nhash = 0;
  temp = 0;
  if ((isrecurse = (c == DEF_MAGIC)))   /* If recursive macro   */
    c = get(global);                    /* hack, skip DEF_MAGIC */
  ct = 0;
  do {
    if (ct == global->tokenbsize)
      global->tokenbuf = incmem(global, global->tokenbuf, 1 + (global->tokenbsize *= 2));
    global->tokenbuf[ct++] = c; 	/* Store token byte	*/
    nhash += c; 			/* Update hash value	*/
    c = get(global);
  }  while (type[c] == LET || type[c] == DIG);
  unget(global);                        /* Rescan terminator    */
  global->tokenbuf[ct] = EOS;		/* Terminate token	*/
  if (isrecurse)                        /* Recursive definition */
    return(NULL);                       /* undefined just now   */
  nhash += ct;				/* Fix hash value	*/
  dp = global->symtab[nhash % SBSIZE];  /* Starting bucket	*/
  while (dp != (DEFBUF *) NULL) {       /* Search symbol table  */
    if (dp->hash == nhash               /* Fast precheck        */
	&& (temp = strcmp(dp->name, global->tokenbuf)) >= 0)
      break;
    dp = dp->link;			/* Nope, try next one	*/
  }
  return((temp == 0) ? dp : NULL);
}